

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int lhCursorSeek(unqlite_kv_cursor *pCursor,void *pKey,int nByte,int iPos)

{
  lhash_kv_engine *pEngine;
  int iVar1;
  undefined4 uVar2;
  sxu32 nHash;
  lhpage *in_RAX;
  ulong uVar3;
  lhcell *plVar4;
  lhash_bmap_rec *plVar5;
  ulong uVar6;
  int in_R8D;
  int iVar7;
  lhpage *local_38;
  
  pEngine = (lhash_kv_engine *)pCursor->pStore;
  local_38 = in_RAX;
  iVar1 = (*pEngine->pIo->xGet)(pEngine->pIo->pHandle,1,&pEngine->pHeader);
  if (iVar1 == 0) {
    nHash = (*pEngine->xHash)(pKey,nByte);
    uVar6 = (ulong)((int)pEngine->nmax_split_nucket - 1U & nHash);
    uVar3 = (ulong)((int)pEngine->max_split_bucket - 1U & nHash);
    if (uVar6 < pEngine->split_bucket + pEngine->max_split_bucket) {
      uVar3 = uVar6;
    }
    iVar7 = -6;
    iVar1 = iVar7;
    if (pEngine->nBuckRec != 0) {
      for (plVar5 = pEngine->apMap[pEngine->nBuckSize - 1 & (uint)uVar3];
          plVar5 != (lhash_bmap_rec *)0x0; plVar5 = plVar5->pNextCol) {
        if (plVar5->iLogic == uVar3) {
          iVar1 = lhLoadPage(pEngine,plVar5->iReal,(lhpage *)0x0,&local_38,in_R8D);
          if ((iVar1 == 0) &&
             (plVar4 = lhFindCell(local_38,pKey,nByte,nHash), iVar1 = iVar7, plVar4 != (lhcell *)0x0
             )) {
            pCursor[2].pStore = (unqlite_kv_engine *)plVar4;
            iVar1 = 0;
            uVar2 = 2;
            goto LAB_001120b5;
          }
          break;
        }
      }
    }
  }
  pCursor[2].pStore = (unqlite_kv_engine *)0x0;
  uVar2 = 3;
LAB_001120b5:
  *(undefined4 *)&pCursor[1].pStore = uVar2;
  return iVar1;
}

Assistant:

static int lhCursorSeek(unqlite_kv_cursor *pCursor,const void *pKey,int nByte,int iPos)
{
	lhash_kv_cursor *pCur = (lhash_kv_cursor *)pCursor;
	int rc;
	/* Perform a lookup */
	rc = lhRecordLookup((lhash_kv_engine *)pCur->pStore,pKey,nByte,&pCur->pCell);
	if( rc != UNQLITE_OK ){
		SXUNUSED(iPos);
		pCur->pCell = 0;
		pCur->iState = L_HASH_CURSOR_STATE_DONE;
		return rc;
	}
	pCur->iState = L_HASH_CURSOR_STATE_CELL;
	return UNQLITE_OK;
}